

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::ExpressionBinder::BindUnsupportedExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,ParsedExpression *expr,
          idx_t depth,string *message)

{
  ErrorData result;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  idx_t local_130;
  undefined1 local_128 [128];
  undefined1 local_a8 [128];
  
  local_130 = depth;
  ErrorData::ErrorData((ErrorData *)local_128);
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_158._M_unused._M_object = operator_new(0x18);
  *(ExpressionBinder **)local_158._M_unused._0_8_ = this;
  *(idx_t **)((long)local_158._M_unused._0_8_ + 8) = &local_130;
  *(ErrorData **)((long)local_158._M_unused._0_8_ + 0x10) = (ErrorData *)local_128;
  pcStack_140 = ::std::
                _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression_binder.cpp:386:12)>
                ::_M_invoke;
  local_148 = ::std::
              _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression_binder.cpp:386:12)>
              ::_M_manager;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                   *)&local_158);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  if (local_128[0] == true) {
    local_a8._0_2_ = local_128._0_2_;
    if ((undefined1 *)local_128._8_8_ == local_128 + 0x18) {
      local_a8._32_4_ = local_128._32_4_;
      local_a8._36_4_ = local_128._36_4_;
      local_a8._8_8_ = local_a8 + 0x18;
    }
    else {
      local_a8._8_8_ = local_128._8_8_;
    }
    local_a8._16_8_ = local_128._16_8_;
    local_128._16_8_ = 0;
    local_128._24_4_ = local_128._24_4_ & 0xffffff00;
    if ((undefined1 *)local_128._40_8_ == local_128 + 0x38) {
      local_a8._64_4_ = local_128._64_4_;
      local_a8._68_4_ = local_128._68_4_;
      local_a8._40_8_ = local_a8 + 0x38;
    }
    else {
      local_a8._40_8_ = local_128._40_8_;
    }
    local_a8._48_8_ = local_128._48_8_;
    local_128._48_8_ = 0;
    local_128._56_4_ = local_128._56_4_ & 0xffffff00;
    local_128._8_8_ = local_128 + 0x18;
    local_128._40_8_ = local_128 + 0x38;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_a8 + 0x48),local_128 + 0x48);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_a8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_a8 + 0x48));
    if ((undefined1 *)local_a8._40_8_ != local_a8 + 0x38) {
      operator_delete((void *)local_a8._40_8_);
    }
    if ((undefined1 *)local_a8._8_8_ != local_a8 + 0x18) {
      operator_delete((void *)local_a8._8_8_);
    }
  }
  else {
    BinderException::Unsupported((BinderException *)&local_158,expr,message);
    BindResult::BindResult(__return_storage_ptr__,(Exception *)&local_158);
    ::std::runtime_error::~runtime_error((runtime_error *)local_158._M_pod_data);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_128 + 0x48));
  if ((undefined1 *)local_128._40_8_ != local_128 + 0x38) {
    operator_delete((void *)local_128._40_8_);
  }
  if ((undefined1 *)local_128._8_8_ != local_128 + 0x18) {
    operator_delete((void *)local_128._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindUnsupportedExpression(ParsedExpression &expr, idx_t depth, const string &message) {
	// we always prefer to throw an error if it occurs in a child expression
	// since that error might be more descriptive
	// bind all children
	ErrorData result;
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](unique_ptr<ParsedExpression> &child) { BindChild(child, depth, result); });
	if (result.HasError()) {
		return BindResult(std::move(result));
	}
	return BindResult(BinderException::Unsupported(expr, message));
}